

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void __thiscall NNTreeIterator::updateIValue(NNTreeIterator *this,bool allow_invalid)

{
  int iVar1;
  QPDF *qpdf;
  bool bVar2;
  int iVar3;
  logic_error *this_00;
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  allocator<char> local_79;
  string local_78;
  QPDFObjectHandle local_58;
  QPDFObjectHandle local_48 [2];
  undefined1 local_28 [8];
  QPDFObjectHandle items;
  bool okay;
  bool allow_invalid_local;
  NNTreeIterator *this_local;
  
  items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._6_1_ = 0;
  items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = allow_invalid;
  if ((-1 < this->item_number) && (bVar2 = QPDFObjectHandle::isDictionary(&this->node), bVar2)) {
    (*(code *)**(undefined8 **)this->impl->details)();
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_28,(string *)&this->node);
    iVar1 = this->item_number;
    iVar3 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_28);
    if (iVar1 + 1 < iVar3) {
      items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._6_1_ = 1;
      QPDFObjectHandle::getArrayItem(local_48,(int)local_28);
      QPDFObjectHandle::operator=(&(this->ivalue).first,local_48);
      QPDFObjectHandle::~QPDFObjectHandle(local_48);
      QPDFObjectHandle::getArrayItem(&local_58,(int)local_28);
      QPDFObjectHandle::operator=(&(this->ivalue).second,&local_58);
      QPDFObjectHandle::~QPDFObjectHandle(&local_58);
    }
    else {
      qpdf = this->impl->qpdf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"update ivalue: items array is too short",&local_79);
      ::error(qpdf,&this->node,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  }
  if ((items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._6_1_ & 1) == 0) {
    if ((items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) == 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"attempt made to dereference an invalid name/number tree iterator");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    memset(&local_90,0,0x10);
    QPDFObjectHandle::QPDFObjectHandle(&local_90);
    QPDFObjectHandle::operator=(&(this->ivalue).first,&local_90);
    QPDFObjectHandle::~QPDFObjectHandle(&local_90);
    memset(&local_a0,0,0x10);
    QPDFObjectHandle::QPDFObjectHandle(&local_a0);
    QPDFObjectHandle::operator=(&(this->ivalue).second,&local_a0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
  }
  return;
}

Assistant:

void
NNTreeIterator::updateIValue(bool allow_invalid)
{
    // ivalue should never be used inside the class since we return a pointer/reference to it. Every
    // bit of code that ever changes what object the iterator points to should take care to call
    // updateIValue. Failure to do this means that any old references to *iter will point to
    // incorrect objects, though the next dereference of the iterator will fix it. This isn't
    // necessarily catastrophic, but it would be confusing. The test suite attempts to exercise
    // various cases to ensure we don't introduce that bug in the future, but sadly it's tricky to
    // verify by reasoning about the code that this constraint is always satisfied. Whenever we
    // update what the iterator points to, we should call setItemNumber, which calls this. If we
    // change what the iterator points to in some other way, such as replacing a value or removing
    // an item and making the iterator point at a different item in potentially the same position,
    // we must call updateIValue as well. These cases are handled, and for good measure, we also
    // call updateIValue in operator* and operator->.

    bool okay = false;
    if ((item_number >= 0) && this->node.isDictionary()) {
        auto items = this->node.getKey(impl.details.itemsKey());
        if (this->item_number + 1 < items.getArrayNItems()) {
            okay = true;
            this->ivalue.first = items.getArrayItem(this->item_number);
            this->ivalue.second = items.getArrayItem(1 + this->item_number);
        } else {
            error(impl.qpdf, node, "update ivalue: items array is too short");
        }
    }
    if (!okay) {
        if (!allow_invalid) {
            throw std::logic_error(
                "attempt made to dereference an invalid name/number tree iterator");
        }
        this->ivalue.first = QPDFObjectHandle();
        this->ivalue.second = QPDFObjectHandle();
    }
}